

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5UnicodeTokenize(Fts5Tokenizer *pTokenizer,void *pCtx,int iUnused,char *pText,int nText,
                       _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  byte *pbVar8;
  bool bVar9;
  int local_8c;
  int ie;
  int is;
  char *zOut;
  byte *pbStack_78;
  u32 iCode;
  char *pEnd;
  byte *pbStack_68;
  int nFold;
  char *aFold;
  uchar *zCsr;
  uchar *zTerm;
  uchar *a;
  int rc;
  Unicode61Tokenizer *p;
  _func_int_void_ptr_int_char_ptr_int_int_int *xToken_local;
  int nText_local;
  char *pText_local;
  int iUnused_local;
  void *pCtx_local;
  Fts5Tokenizer *pTokenizer_local;
  
  a._4_4_ = 0;
  pcVar6 = pText + nText;
  pbStack_68 = *(byte **)(pTokenizer + 0x80);
  pEnd._4_4_ = *(int *)(pTokenizer + 0x88);
  pbStack_78 = pbStack_68 + (pEnd._4_4_ + -6);
  aFold = pText;
  while (a._4_4_ == 0) {
    _ie = pbStack_68;
    do {
      while( true ) {
        if (pcVar6 <= aFold) goto LAB_0028ab6c;
        iVar1 = (int)pText;
        if ((*aFold & 0x80U) != 0) break;
        if (pTokenizer[(byte)*aFold] != (Fts5Tokenizer)0x0) {
          local_8c = (int)aFold - iVar1;
          goto LAB_0028aac7;
        }
        aFold = aFold + 1;
      }
      local_8c = (int)aFold - iVar1;
      pcVar7 = aFold + 1;
      zOut._4_4_ = (uint)(byte)*aFold;
      aFold = pcVar7;
      if (0xbf < zOut._4_4_) {
        zOut._4_4_ = (uint)""[zOut._4_4_ - 0xc0];
        while( true ) {
          bVar9 = false;
          if (aFold != pcVar6) {
            bVar9 = (*aFold & 0xc0U) == 0x80;
          }
          if (!bVar9) break;
          zOut._4_4_ = zOut._4_4_ * 0x40 + ((byte)*aFold & 0x3f);
          aFold = aFold + 1;
        }
        if (((zOut._4_4_ < 0x80) || ((zOut._4_4_ & 0xfffff800) == 0xd800)) ||
           ((zOut._4_4_ & 0xfffffffe) == 0xfffe)) {
          zOut._4_4_ = 0xfffd;
        }
      }
      iVar3 = fts5UnicodeIsAlnum((Unicode61Tokenizer *)pTokenizer,zOut._4_4_);
    } while (iVar3 == 0);
    do {
      uVar5 = sqlite3Fts5UnicodeFold(zOut._4_4_,*(int *)(pTokenizer + 0x8c));
      if (uVar5 != 0) {
        bVar2 = (byte)uVar5;
        if (uVar5 < 0x80) {
          *_ie = bVar2;
          _ie = _ie + 1;
        }
        else if (uVar5 < 0x800) {
          pbVar8 = _ie + 1;
          *_ie = ((byte)(uVar5 >> 6) & 0x1f) - 0x40;
          _ie = _ie + 2;
          *pbVar8 = (bVar2 & 0x3f) + 0x80;
        }
        else if (uVar5 < 0x10000) {
          *_ie = ((byte)(uVar5 >> 0xc) & 0xf) - 0x20;
          pbVar8 = _ie + 2;
          _ie[1] = ((byte)(uVar5 >> 6) & 0x3f) + 0x80;
          _ie = _ie + 3;
          *pbVar8 = (bVar2 & 0x3f) + 0x80;
        }
        else {
          *_ie = ((byte)(uVar5 >> 0x12) & 7) - 0x10;
          _ie[1] = ((byte)(uVar5 >> 0xc) & 0x3f) + 0x80;
          pbVar8 = _ie + 3;
          _ie[2] = ((byte)(uVar5 >> 6) & 0x3f) + 0x80;
          _ie = _ie + 4;
          *pbVar8 = (bVar2 & 0x3f) + 0x80;
        }
      }
      while( true ) {
        iVar3 = (int)aFold;
        if (pcVar6 <= aFold) goto LAB_0028ab39;
        if (pbStack_78 < _ie) {
          pbStack_68 = (byte *)sqlite3_malloc64((long)pEnd._4_4_ << 1);
          if (pbStack_68 == (byte *)0x0) {
            a._4_4_ = 7;
            goto LAB_0028ab6c;
          }
          _ie = pbStack_68 + ((long)_ie - *(long *)(pTokenizer + 0x80));
          memcpy(pbStack_68,*(void **)(pTokenizer + 0x80),(long)pEnd._4_4_);
          sqlite3_free(*(void **)(pTokenizer + 0x80));
          *(byte **)(pTokenizer + 0x80) = pbStack_68;
          pEnd._4_4_ = pEnd._4_4_ * 2;
          *(int *)(pTokenizer + 0x88) = pEnd._4_4_;
          pbStack_78 = pbStack_68 + (pEnd._4_4_ + -6);
        }
        if ((*aFold & 0x80U) != 0) break;
        if (pTokenizer[(byte)*aFold] == (Fts5Tokenizer)0x0) goto LAB_0028ab39;
LAB_0028aac7:
        if (((byte)*aFold < 0x41) || (0x5a < (byte)*aFold)) {
          *_ie = *aFold;
        }
        else {
          *_ie = *aFold + 0x20;
        }
        _ie = _ie + 1;
        aFold = aFold + 1;
      }
      pcVar7 = aFold + 1;
      zOut._4_4_ = (uint)(byte)*aFold;
      aFold = pcVar7;
      if (0xbf < zOut._4_4_) {
        zOut._4_4_ = (uint)""[zOut._4_4_ - 0xc0];
        while( true ) {
          bVar9 = false;
          if (aFold != pcVar6) {
            bVar9 = (*aFold & 0xc0U) == 0x80;
          }
          if (!bVar9) break;
          zOut._4_4_ = zOut._4_4_ * 0x40 + ((byte)*aFold & 0x3f);
          aFold = aFold + 1;
        }
        if (((zOut._4_4_ < 0x80) || ((zOut._4_4_ & 0xfffff800) == 0xd800)) ||
           ((zOut._4_4_ & 0xfffffffe) == 0xfffe)) {
          zOut._4_4_ = 0xfffd;
        }
      }
      iVar4 = fts5UnicodeIsAlnum((Unicode61Tokenizer *)pTokenizer,zOut._4_4_);
    } while ((iVar4 != 0) || (iVar4 = sqlite3Fts5UnicodeIsdiacritic(zOut._4_4_), iVar4 != 0));
LAB_0028ab39:
    a._4_4_ = (*xToken)(pCtx,0,(char *)pbStack_68,(int)_ie - (int)pbStack_68,local_8c,iVar3 - iVar1)
    ;
  }
LAB_0028ab6c:
  if (a._4_4_ == 0x65) {
    a._4_4_ = 0;
  }
  return a._4_4_;
}

Assistant:

static int fts5UnicodeTokenize(
  Fts5Tokenizer *pTokenizer,
  void *pCtx,
  int iUnused,
  const char *pText, int nText,
  int (*xToken)(void*, int, const char*, int nToken, int iStart, int iEnd)
){
  Unicode61Tokenizer *p = (Unicode61Tokenizer*)pTokenizer;
  int rc = SQLITE_OK;
  unsigned char *a = p->aTokenChar;

  unsigned char *zTerm = (unsigned char*)&pText[nText];
  unsigned char *zCsr = (unsigned char *)pText;

  /* Output buffer */
  char *aFold = p->aFold;
  int nFold = p->nFold;
  const char *pEnd = &aFold[nFold-6];

  UNUSED_PARAM(iUnused);

  /* Each iteration of this loop gobbles up a contiguous run of separators,
  ** then the next token.  */
  while( rc==SQLITE_OK ){
    u32 iCode;                    /* non-ASCII codepoint read from input */
    char *zOut = aFold;
    int is;
    int ie;

    /* Skip any separator characters. */
    while( 1 ){
      if( zCsr>=zTerm ) goto tokenize_done;
      if( *zCsr & 0x80 ) {
        /* A character outside of the ascii range. Skip past it if it is
        ** a separator character. Or break out of the loop if it is not. */
        is = zCsr - (unsigned char*)pText;
        READ_UTF8(zCsr, zTerm, iCode);
        if( fts5UnicodeIsAlnum(p, iCode) ){
          goto non_ascii_tokenchar;
        }
      }else{
        if( a[*zCsr] ){
          is = zCsr - (unsigned char*)pText;
          goto ascii_tokenchar;
        }
        zCsr++;
      }
    }

    /* Run through the tokenchars. Fold them into the output buffer along
    ** the way.  */
    while( zCsr<zTerm ){

      /* Grow the output buffer so that there is sufficient space to fit the
      ** largest possible utf-8 character.  */
      if( zOut>pEnd ){
        aFold = sqlite3_malloc64((sqlite3_int64)nFold*2);
        if( aFold==0 ){
          rc = SQLITE_NOMEM;
          goto tokenize_done;
        }
        zOut = &aFold[zOut - p->aFold];
        memcpy(aFold, p->aFold, nFold);
        sqlite3_free(p->aFold);
        p->aFold = aFold;
        p->nFold = nFold = nFold*2;
        pEnd = &aFold[nFold-6];
      }

      if( *zCsr & 0x80 ){
        /* An non-ascii-range character. Fold it into the output buffer if
        ** it is a token character, or break out of the loop if it is not. */
        READ_UTF8(zCsr, zTerm, iCode);
        if( fts5UnicodeIsAlnum(p,iCode)||sqlite3Fts5UnicodeIsdiacritic(iCode) ){
 non_ascii_tokenchar:
          iCode = sqlite3Fts5UnicodeFold(iCode, p->eRemoveDiacritic);
          if( iCode ) WRITE_UTF8(zOut, iCode);
        }else{
          break;
        }
      }else if( a[*zCsr]==0 ){
        /* An ascii-range separator character. End of token. */
        break; 
      }else{
 ascii_tokenchar:
        if( *zCsr>='A' && *zCsr<='Z' ){
          *zOut++ = *zCsr + 32;
        }else{
          *zOut++ = *zCsr;
        }
        zCsr++;
      }
      ie = zCsr - (unsigned char*)pText;
    }

    /* Invoke the token callback */
    rc = xToken(pCtx, 0, aFold, zOut-aFold, is, ie); 
  }
  
 tokenize_done:
  if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  return rc;
}